

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,void *buffer_,
          size_t total_size)

{
  uchar *puVar1;
  DatabaseInterface *pDVar2;
  uint uVar3;
  Impl *this_00;
  StateCreatorInterface *iface_00;
  bool bVar4;
  bool bVar5;
  Type pGVar6;
  Type pdf_info;
  Ch *__nptr;
  ulonglong uVar7;
  ParseErrorCode error;
  Data *this_01;
  uchar *puVar8;
  uchar *varint;
  long *in_FS_OFFSET;
  MemoryStream ms;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> is;
  Data local_e0;
  uchar *local_d0;
  uchar *local_c8;
  DatabaseInterface *local_c0;
  Data local_b8;
  undefined8 *local_a8;
  undefined8 *puStack_a0;
  Stack<rapidjson::CrtAllocator> local_98;
  uint local_68;
  undefined8 local_60;
  uchar *local_50;
  Impl *local_48;
  StateCreatorInterface *local_40;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> local_38;
  
  puVar8 = (uchar *)(total_size + (long)buffer_);
  local_b8.n = (Number)((ulong)local_b8.n & 0xffffffffffffff00);
  local_c0 = resolver;
  local_48 = this;
  local_40 = iface;
  local_d0 = std::__find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (buffer_,puVar8,&local_b8);
  local_50 = local_d0 + -(long)buffer_;
  varint = local_d0 + 1;
  puVar1 = puVar8 + -(long)(local_d0 + 1);
  if (puVar8 <= local_d0) {
    varint = (uchar *)0x0;
    puVar1 = (uchar *)0x0;
  }
  local_98.stackEnd_ = (char *)0x0;
  local_98.stack_ = (char *)0x0;
  local_98.stackTop_ = (char *)0x0;
  local_98.allocator_ = (CrtAllocator *)0x0;
  local_98.ownAllocator_ = (CrtAllocator *)0x0;
  local_a8 = (undefined8 *)0x0;
  puStack_a0 = (undefined8 *)0x0;
  local_b8.n = (Number)0x0;
  local_b8.s.str = (Ch *)0x0;
  local_98.initialCapacity_ = 0x400;
  local_68 = 0;
  local_60 = 0;
  local_a8 = (undefined8 *)operator_new(0x28);
  *local_a8 = 0;
  local_a8[1] = 0x10000;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_c8 = local_50;
  local_e0.n = (Number)buffer_;
  local_e0.s.str = (Ch *)buffer_;
  puStack_a0 = local_a8;
  rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::EncodedInputStream
            (&local_38,(MemoryStream *)&local_e0.s);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::
  ParseStream<0u,rapidjson::UTF8<char>,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&local_b8.s,&local_38);
  iface_00 = local_40;
  this_00 = local_48;
  uVar3 = local_68;
  if (local_68 == 0) {
    local_50 = puVar1;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)&local_b8.s,"version");
    if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x20000000000000) ==
        (undefined1  [16])0x0) {
      __assert_fail("data_.f.flags & kIntFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x718,
                    "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    if (0xfffffffd < (pGVar6->data_).s.length - 7) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_e0.s,(Ch *)&local_b8);
        if (local_b8.f.flags != 3) goto LAB_0011887e;
        if (local_e0.n.i64 !=
            (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                    ((ulong)local_b8.s.str & 0xffffffffffff))) {
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)&local_b8.s,"applicationInfo");
          pdf_info = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)&local_b8.s,"physicalDeviceFeatures");
          bVar5 = parse_application_info(this_00,iface_00,pGVar6,pdf_info);
          if (!bVar5) goto LAB_00118851;
        }
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b8.s,"application");
        __nptr = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pGVar6);
        uVar7 = strtoull(__nptr,(char **)0x0,0x10);
        (*iface_00->_vptr_StateCreatorInterface[3])(iface_00,uVar7);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        this_01 = &local_b8;
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&this_01->s,"link");
        parse_application_info_link((Impl *)&this_01->s,iface_00,pGVar6);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      puVar1 = local_50;
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b8.s,"shaderModules");
        bVar5 = parse_shader_modules(this_00,iface_00,pGVar6,varint,(size_t)puVar1);
        if (!bVar5) goto LAB_00118851;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b8.s,"samplers");
        bVar5 = parse_samplers(this_00,iface_00,pGVar6);
        if (!bVar5) goto LAB_00118851;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      pDVar2 = local_c0;
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b8.s,"setLayouts");
        bVar5 = parse_descriptor_set_layouts(this_00,iface_00,pDVar2,pGVar6);
        if (!bVar5) goto LAB_00118851;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b8.s,"pipelineLayouts");
        bVar5 = parse_pipeline_layouts(this_00,iface_00,pGVar6);
        if (!bVar5) goto LAB_00118851;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b8.s,"renderPasses");
        bVar5 = parse_render_passes(this_00,iface_00,pGVar6);
        if (!bVar5) goto LAB_00118851;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b8.s,"renderPasses2");
        bVar5 = parse_render_passes2(this_00,iface_00,pGVar6);
        if (!bVar5) goto LAB_00118851;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      pDVar2 = local_c0;
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b8.s,"computePipelines");
        bVar5 = parse_compute_pipelines(this_00,iface_00,pDVar2,pGVar6);
        if (!bVar5) goto LAB_00118851;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      pDVar2 = local_c0;
      if (local_b8.f.flags != 3) goto LAB_0011887e;
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b8.s,"graphicsPipelines");
        bVar5 = parse_graphics_pipelines(this_00,iface_00,pDVar2,pGVar6);
        if (!bVar5) goto LAB_00118851;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_e0.s,(Ch *)&local_b8);
      pDVar2 = local_c0;
      if (local_b8.f.flags != 3) {
LAB_0011887e:
        __assert_fail("IsObject()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x4db,
                      "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      if (local_e0.n.i64 !=
          (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 +
                  ((ulong)local_b8.s.str & 0xffffffffffff))) {
        pGVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&local_b8.s,"raytracingPipelines");
        bVar5 = parse_raytracing_pipelines(this_00,iface_00,pDVar2,pGVar6);
        if (!bVar5) goto LAB_00118851;
      }
      bVar5 = true;
      goto LAB_00118853;
    }
    if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
      bVar5 = false;
      bVar4 = Internal::log_thread_callback(LOG_ERROR,"JSON version mismatches.");
      if (bVar4) goto LAB_00118853;
      parse();
    }
  }
  else if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
    bVar5 = false;
    bVar4 = Internal::log_thread_callback(LOG_ERROR,"Got parse error: %d\n",(ulong)local_68);
    if (!bVar4) {
      bVar5 = false;
      fprintf(_stderr,"Fossilize ERROR: Got parse error: %d\n",(ulong)uVar3);
    }
    goto LAB_00118853;
  }
LAB_00118851:
  bVar5 = false;
LAB_00118853:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)&local_b8.s);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_98);
  return bVar5;
}

Assistant:

bool StateReplayer::Impl::parse(StateCreatorInterface &iface, DatabaseInterface *resolver, const void *buffer_, size_t total_size)
{
	// All data after a string terminating '\0' is considered binary payload
	// which can be read for various purposes (SPIR-V varint for example).
	const uint8_t *buffer = static_cast<const uint8_t *>(buffer_);
	auto itr = find(buffer, buffer + total_size, '\0');
	const uint8_t *varint_buffer = nullptr;
	size_t varint_size = 0;
	size_t json_size = itr - buffer;

	if (itr < buffer + total_size)
	{
		varint_buffer = itr + 1;
		varint_size = (buffer + total_size) - varint_buffer;
	}

	Document doc;
	doc.Parse(reinterpret_cast<const char *>(buffer), json_size);

	if (doc.HasParseError())
	{
		auto error = doc.GetParseError();
		LOGE_LEVEL("Got parse error: %d\n", int(error));
		return false;
	}

	int version = doc["version"].GetInt();
	if (version > FOSSILIZE_FORMAT_VERSION || version < FOSSILIZE_FORMAT_MIN_COMPAT_VERSION)
	{
		LOGE_LEVEL("JSON version mismatches.");
		return false;
	}

	if (doc.HasMember("applicationInfo") && doc.HasMember("physicalDeviceFeatures"))
		if (!parse_application_info(iface, doc["applicationInfo"], doc["physicalDeviceFeatures"]))
			return false;

	if (doc.HasMember("application"))
		iface.set_current_application_info(string_to_uint64(doc["application"].GetString()));

	if (doc.HasMember("link"))
		if (!parse_application_info_link(iface, doc["link"]))
			return false;

	if (doc.HasMember("shaderModules"))
		if (!parse_shader_modules(iface, doc["shaderModules"], varint_buffer, varint_size))
			return false;

	if (doc.HasMember("samplers"))
		if (!parse_samplers(iface, doc["samplers"]))
			return false;

	if (doc.HasMember("setLayouts"))
		if (!parse_descriptor_set_layouts(iface, resolver, doc["setLayouts"]))
			return false;

	if (doc.HasMember("pipelineLayouts"))
		if (!parse_pipeline_layouts(iface, doc["pipelineLayouts"]))
			return false;

	if (doc.HasMember("renderPasses"))
		if (!parse_render_passes(iface, doc["renderPasses"]))
			return false;

	if (doc.HasMember("renderPasses2"))
		if (!parse_render_passes2(iface, doc["renderPasses2"]))
			return false;

	if (doc.HasMember("computePipelines"))
		if (!parse_compute_pipelines(iface, resolver, doc["computePipelines"]))
			return false;

	if (doc.HasMember("graphicsPipelines"))
		if (!parse_graphics_pipelines(iface, resolver, doc["graphicsPipelines"]))
			return false;

	if (doc.HasMember("raytracingPipelines"))
		if (!parse_raytracing_pipelines(iface, resolver, doc["raytracingPipelines"]))
			return false;

	return true;
}